

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

void __thiscall
BasicContainer::BasicContainer
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list)

{
  const_reference ppBVar1;
  ulong uVar2;
  size_type sVar3;
  AABox local_94;
  AABox local_7c;
  int local_64;
  undefined4 uStack_60;
  int i;
  undefined8 local_58;
  undefined8 local_50;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_48;
  size_type local_20;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *local_18;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list_local;
  BasicContainer *this_local;
  
  local_18 = list;
  list_local = (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)this;
  Primitive::Primitive(&this->super_Primitive);
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_intersect_00266b90;
  AABox::AABox(&this->bound);
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector(&this->list,local_18);
  this->root = (treenode *)0x0;
  local_20 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(local_18);
  github111116::ConsoleLogger::log<char[20],unsigned_long,char[11]>
            (&console,(char (*) [20])"building SAH BVH of",&local_20,(char (*) [11])"primitives");
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector(&local_48,local_18);
  build(this,&local_48,&this->root);
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~vector(&local_48);
  ppBVar1 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[](local_18,0)
  ;
  (*((*ppBVar1)->super_Primitive)._vptr_Primitive[1])(&stack0xffffffffffffffa0);
  (this->bound).x1 = (float)uStack_60;
  (this->bound).x2 = (float)i;
  (this->bound).y1 = (float)(undefined4)local_58;
  (this->bound).y2 = (float)local_58._4_4_;
  (this->bound).z1 = (float)(undefined4)local_50;
  (this->bound).z2 = (float)local_50._4_4_;
  local_64 = 1;
  while( true ) {
    uVar2 = (ulong)local_64;
    sVar3 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(local_18);
    if (sVar3 <= uVar2) break;
    ppBVar1 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                        (local_18,(long)local_64);
    (*((*ppBVar1)->super_Primitive)._vptr_Primitive[1])(&local_94);
    ::operator+(&local_7c,&this->bound,&local_94);
    (this->bound).x1 = local_7c.x1;
    (this->bound).x2 = local_7c.x2;
    (this->bound).y1 = local_7c.y1;
    (this->bound).y2 = local_7c.y2;
    (this->bound).z1 = local_7c.z1;
    (this->bound).z2 = local_7c.z2;
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

BasicContainer(const std::vector<BasicPrimitive*>& list): list(list)
	{
		console.log("building SAH BVH of", list.size(), "primitives");
		build(list, root);
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
	}